

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O0

void cppassert::internal::onAssertionFailureDefaultHandler(AssertionFailure *assertion)

{
  AssertionFailure *failure;
  char *message;
  CppAssertI<cppassert::CppAssertT<cppassert::DefaultFormatter,std::mutex,cppassert::DefaultHandler>>
  local_30 [8];
  string errorAsStr;
  AssertionFailure *assertion_local;
  
  failure = (AssertionFailure *)
            CppAssertI<cppassert::CppAssertT<cppassert::DefaultFormatter,_std::mutex,_cppassert::DefaultHandler>_>
            ::getInstance();
  CppAssertI<cppassert::CppAssertT<cppassert::DefaultFormatter,std::mutex,cppassert::DefaultHandler>>
  ::formatAssertionMessage_abi_cxx11_(local_30,failure);
  message = (char *)std::__cxx11::string::c_str();
  PrintMessageToStdErr(message);
  abort();
}

Assistant:

void onAssertionFailureDefaultHandler(const AssertionFailure &assertion)
{
    const std::string errorAsStr
        = CppAssert::getInstance()->formatAssertionMessage(assertion);

    PrintMessageToStdErr(errorAsStr.c_str());

#if defined(WIN32)
    /*
     * We used to call DebugBreak() on Windows, but amazingly, it causes
     * the MSVS 2010 debugger not to be able to recover a call stack.
     */
    *((int *) NULL) = 0;
    exit(3);
#elif defined(__APPLE__)
    /*
     * On Mac OS X, Breakpad ignores signals. Only real Mach exceptions are
     * trapped.
     */
    *((int *) NULL) = 0;  /* To continue from here in GDB: "return" then "continue". */
    ::abort();  /* In case above statement gets nixed by the optimizer. */
#else
    std::abort(); /* To continue from here in GDB: "signal 0". */
#endif

}